

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngvalid.c
# Opt level: O0

png_uint_32 __thiscall
image_transform_add(void *this,uint max,png_uint_32 counter,char *name,size_t sizeof_name,
                   size_t *pos,png_byte colour_type,png_byte bit_depth)

{
  int iVar1;
  size_t sVar2;
  image_transform *local_48;
  image_transform *list;
  png_uint_32 mask;
  size_t *pos_local;
  size_t sizeof_name_local;
  char *name_local;
  png_uint_32 counter_local;
  uint max_local;
  image_transform **this_local;
  
  name_local._0_4_ = counter;
  while( true ) {
    if ((png_uint_32)name_local == 0) {
      image_transform_reset_count();
      if (max < 2) {
        name_local._0_4_ = 1;
      }
      else {
        name_local._0_4_ = random_32();
      }
    }
    else if (max == 0) {
      name_local._0_4_ = (png_uint_32)name_local + 1;
    }
    else if (max == 1) {
      name_local._0_4_ = (png_uint_32)name_local << 1;
    }
    else {
      name_local._0_4_ = random_32();
    }
    *(image_transform **)this = &image_transform_end;
    list._4_4_ = 1;
    for (local_48 = &image_transform_shift; local_48 != &image_transform_end;
        local_48 = local_48->list) {
      if (((((png_uint_32)name_local & list._4_4_) != 0) && (local_48->enable != 0)) &&
         ((max == 0 || (local_48->local_use < max)))) {
        iVar1 = (*local_48->add)(local_48,(image_transform **)this,colour_type,bit_depth);
        if ((iVar1 == 0) && (max != 0)) {
          *(image_transform **)this = local_48->next;
          local_48->next = (image_transform *)0x0;
          local_48->local_use = max;
        }
        else {
          sVar2 = safecat(name,sizeof_name,*pos," +");
          *pos = sVar2;
          sVar2 = safecat(name,sizeof_name,*pos,local_48->name);
          *pos = sVar2;
        }
      }
      list._4_4_ = list._4_4_ << 1;
    }
    if (*this != &image_transform_end) break;
    iVar1 = image_transform_test_counter((png_uint_32)name_local,max);
    if (iVar1 == 0) {
      return 0;
    }
  }
  return (png_uint_32)name_local;
}

Assistant:

static png_uint_32
image_transform_add(const image_transform **this, unsigned int max,
   png_uint_32 counter, char *name, size_t sizeof_name, size_t *pos,
   png_byte colour_type, png_byte bit_depth)
{
   for (;;) /* until we manage to add something */
   {
      png_uint_32 mask;
      image_transform *list;

      /* Find the next counter value, if the counter is zero this is the start
       * of the list.  This routine always returns the current counter (not the
       * next) so it returns 0 at the end and expects 0 at the beginning.
       */
      if (counter == 0) /* first time */
      {
         image_transform_reset_count();
         if (max <= 1)
            counter = 1;
         else
            counter = random_32();
      }
      else /* advance the counter */
      {
         switch (max)
         {
            case 0:  ++counter; break;
            case 1:  counter <<= 1; break;
            default: counter = random_32(); break;
         }
      }

      /* Now add all these items, if possible */
      *this = &image_transform_end;
      list = image_transform_first;
      mask = 1;

      /* Go through the whole list adding anything that the counter selects: */
      while (list != &image_transform_end)
      {
         if ((counter & mask) != 0 && list->enable &&
             (max == 0 || list->local_use < max))
         {
            /* Candidate to add: */
            if (list->add(list, this, colour_type, bit_depth) || max == 0)
            {
               /* Added, so add to the name too. */
               *pos = safecat(name, sizeof_name, *pos, " +");
               *pos = safecat(name, sizeof_name, *pos, list->name);
            }

            else
            {
               /* Not useful and max>0, so remove it from *this: */
               *this = list->next;
               list->next = 0;

               /* And, since we know it isn't useful, stop it being added again
                * in this run:
                */
               list->local_use = max;
            }
         }

         mask <<= 1;
         list = list->list;
      }

      /* Now if anything was added we have something to do. */
      if (*this != &image_transform_end)
         return counter;

      /* Nothing added, but was there anything in there to add? */
      if (!image_transform_test_counter(counter, max))
         return 0;
   }
}